

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotMap.c
# Opt level: O2

_Bool beenChecked(int *prevChecked,int position)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if (uVar2 == 0x480) break;
    uVar1 = uVar2 + 1;
  } while (prevChecked[uVar2] != position);
  return uVar2 < 0x480;
}

Assistant:

bool beenChecked(int prevChecked[], int position) {
    int arrayLength;

    arrayLength = MAP_COLS * MAP_ROWS;
    for (int i = 0; i < arrayLength; i++) {
        if (prevChecked[i] == position)
            return true;
    }
    return false;
}